

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall tchecker::syncprod::synchronizer_t::locations_edges_events(synchronizer_t *this)

{
  __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  undefined4 src_00;
  bool bVar1;
  process_id_t pid_00;
  loc_id_t lVar2;
  event_id_t event_id_00;
  reference y;
  state_t *psVar3;
  element_type *peVar4;
  reference ptVar5;
  __tuple_element_t<1UL,_tuple<unsigned_int,_intrusive_shared_ptr_t<make_shared_t<state_t,_unsigned_long,_1UL>_>,_intrusive_shared_ptr_t<make_shared_t<transition_t,_unsigned_long,_1UL>_>_>_>_conflict
  *p_Var6;
  transition_t *ptVar7;
  attributes_t local_498;
  event_id_t local_45c;
  undefined1 auStack_458 [4];
  event_id_t event_id;
  size_type sStack_450;
  __node_base local_448;
  size_type sStack_440;
  _Prime_rehash_policy local_438;
  __node_base_ptr local_428;
  undefined1 local_418 [8];
  string event_name;
  loc_id_t tgt_id;
  undefined1 local_3a8 [8];
  string tgt_name;
  type *transition_1;
  type *tgt;
  type_conflict2 *status_1;
  __normal_iterator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_*,_std::vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>_>
  local_368;
  iterator __end3;
  iterator __begin3;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *__range3;
  undefined1 local_330 [24];
  loc_id_t src_id;
  const_state_sptr_t src;
  undefined1 local_2d8 [8];
  string state_name;
  type *transition;
  type *state;
  type_conflict2 *status;
  __normal_iterator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_*,_std::vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>_>
  local_298;
  iterator __end2;
  iterator __begin2;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *__range2;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  v;
  undefined1 local_258 [8];
  syncprod_t sp;
  stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
  waiting;
  process_id_t pid;
  size_t table_size;
  size_t block_size;
  synchronizer_t *this_local;
  
  pid_00 = tchecker::system::processes_t::process_id
                     (&(this->_product).super_processes_t,&this->_process_name);
  std::
  stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>,std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>>>>
  ::
  stack<std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>>>,void>
            ((stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>,std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>>>>
              *)&sp._transition_allocator.
                 super_transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
                 ._vedge_cache.
                 super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount);
  syncprod_t::syncprod_t((syncprod_t *)local_258,&this->_system,NO_SHARING,10000,0x10000);
  std::
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ::vector((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
            *)&__range2);
  syncprod_t::initial((syncprod_t *)local_258,
                      (vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
                       *)&__range2,1);
  __end2 = std::
           vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
           ::begin((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
                    *)&__range2);
  local_298._M_current =
       (tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
        *)std::
          vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
          ::end((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
                 *)&__range2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&local_298);
    if (!bVar1) break;
    ptVar5 = __gnu_cxx::
             __normal_iterator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_*,_std::vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>_>
             ::operator*(&__end2);
    std::
    get<0ul,unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,unsigned_long,1ul>>>
              (ptVar5);
    p_Var6 = std::
             get<1ul,unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,unsigned_long,1ul>>>
                       (ptVar5);
    state_name.field_2._8_8_ =
         std::
         get<2ul,unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,unsigned_long,1ul>>>
                   (ptVar5);
    psVar3 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>
              ::operator*(p_Var6)->super_state_t;
    namify_abi_cxx11_((string *)local_2d8,this,psVar3);
    bVar1 = tchecker::system::locs_t::is_location
                      (&(this->_product).super_locs_t,pid_00,(string *)local_2d8);
    if (!bVar1) {
      psVar3 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>
                ::operator*(p_Var6)->super_state_t;
      attributes((attributes_t *)&src,this,psVar3);
      tchecker::system::system_t::add_location
                (&this->_product,pid_00,(string *)local_2d8,(attributes_t *)&src);
      tchecker::system::attributes_t::~attributes_t((attributes_t *)&src);
      std::
      stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
      ::push((stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
              *)&sp._transition_allocator.
                 super_transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
                 ._vedge_cache.
                 super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount,p_Var6);
    }
    std::__cxx11::string::~string((string *)local_2d8);
    __gnu_cxx::
    __normal_iterator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_*,_std::vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ::clear((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
           *)&__range2);
  while( true ) {
    bVar1 = std::
            stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
            ::empty((stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
                     *)&sp._transition_allocator.
                        super_transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
                        ._vedge_cache.
                        super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    y = std::
        stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
        ::top((stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
               *)&sp._transition_allocator.
                  super_transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
                  ._vedge_cache.
                  super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>const>
    ::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>
              ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>const>
                *)&stack0xfffffffffffffce8,y);
    std::
    stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
    ::pop((stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
           *)&sp._transition_allocator.
              super_transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
              ._vedge_cache.
              super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
    psVar3 = &intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>
              ::operator*((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>
                           *)&stack0xfffffffffffffce8)->super_state_t;
    namify_abi_cxx11_((string *)&__range3,this,psVar3);
    tchecker::system::locs_t::location
              ((locs_t *)local_330,(int)this + 0x280,(string *)(ulong)pid_00);
    peVar4 = std::
             __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_330);
    lVar2 = tchecker::system::loc_t::id(peVar4);
    std::shared_ptr<const_tchecker::system::loc_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::loc_t> *)local_330);
    std::__cxx11::string::~string((string *)&__range3);
    local_330._20_4_ = lVar2;
    syncprod_t::next((syncprod_t *)local_258,(const_state_sptr_t *)&stack0xfffffffffffffce8,
                     (vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
                      *)&__range2,1);
    __end3 = std::
             vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
             ::begin((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
                      *)&__range2);
    local_368._M_current =
         (tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
          *)std::
            vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
            ::end((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
                   *)&__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end3,&local_368);
      if (!bVar1) break;
      ptVar5 = __gnu_cxx::
               __normal_iterator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_*,_std::vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>_>
               ::operator*(&__end3);
      std::
      get<0ul,unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,unsigned_long,1ul>>>
                (ptVar5);
      p_Var6 = std::
               get<1ul,unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,unsigned_long,1ul>>>
                         (ptVar5);
      tgt_name.field_2._8_8_ =
           std::
           get<2ul,unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,unsigned_long,1ul>>>
                     (ptVar5);
      psVar3 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>
                ::operator*(p_Var6)->super_state_t;
      namify_abi_cxx11_((string *)local_3a8,this,psVar3);
      bVar1 = tchecker::system::locs_t::is_location
                        (&(this->_product).super_locs_t,pid_00,(string *)local_3a8);
      if (!bVar1) {
        psVar3 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>
                  ::operator*(p_Var6)->super_state_t;
        attributes((attributes_t *)&stack0xfffffffffffffc20,this,psVar3);
        tchecker::system::system_t::add_location
                  (&this->_product,pid_00,(string *)local_3a8,
                   (attributes_t *)&stack0xfffffffffffffc20);
        tchecker::system::attributes_t::~attributes_t((attributes_t *)&stack0xfffffffffffffc20);
        std::
        stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
        ::push((stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
                *)&sp._transition_allocator.
                   super_transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
                   ._vedge_cache.
                   super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,p_Var6);
      }
      tchecker::system::locs_t::location
                ((locs_t *)((long)&event_name.field_2 + 8),(int)this + 0x280,(string *)(ulong)pid_00
                );
      this_00 = (__shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)((long)&event_name.field_2 + 8);
      peVar4 = std::
               __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_00);
      lVar2 = tchecker::system::loc_t::id(peVar4);
      std::shared_ptr<const_tchecker::system::loc_t>::~shared_ptr
                ((shared_ptr<const_tchecker::system::loc_t> *)this_00);
      ptVar7 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
                ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
                             *)tgt_name.field_2._8_8_)->super_transition_t;
      namify_abi_cxx11_((string *)local_418,this,ptVar7);
      bVar1 = tchecker::system::events_t::is_event
                        (&(this->_product).super_events_t,(string *)local_418);
      if (!bVar1) {
        local_438._M_max_load_factor = 0.0;
        local_438._4_4_ = 0;
        local_438._M_next_resize = 0;
        local_448._M_nxt = (_Hash_node_base *)0x0;
        sStack_440 = 0;
        _auStack_458 = (__buckets_ptr)0x0;
        sStack_450 = 0;
        local_428 = (__node_base_ptr)0x0;
        tchecker::system::attributes_t::attributes_t((attributes_t *)auStack_458);
        tchecker::system::events_t::add_event
                  (&(this->_product).super_events_t,(string *)local_418,(attributes_t *)auStack_458)
        ;
        tchecker::system::attributes_t::~attributes_t((attributes_t *)auStack_458);
      }
      event_id_00 = tchecker::system::events_t::event_id
                              (&(this->_product).super_events_t,(string *)local_418);
      src_00 = local_330._20_4_;
      local_45c = event_id_00;
      ptVar7 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
                ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
                             *)tgt_name.field_2._8_8_)->super_transition_t;
      attributes(&local_498,this,ptVar7);
      tchecker::system::system_t::add_edge
                (&this->_product,pid_00,src_00,lVar2,event_id_00,&local_498);
      tchecker::system::attributes_t::~attributes_t(&local_498);
      std::__cxx11::string::~string((string *)local_418);
      std::__cxx11::string::~string((string *)local_3a8);
      __gnu_cxx::
      __normal_iterator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_*,_std::vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
    ::clear((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
             *)&__range2);
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>
                *)&stack0xfffffffffffffce8);
  }
  std::
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ::~vector((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
             *)&__range2);
  syncprod_t::~syncprod_t((syncprod_t *)local_258);
  std::
  stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
  ::~stack((stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
            *)&sp._transition_allocator.
               super_transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
               ._vedge_cache.
               super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount);
  return;
}

Assistant:

void locations_edges_events()
  {
    std::size_t const block_size = 10000;
    std::size_t const table_size = 65536;

    tchecker::process_id_t pid = _product.process_id(_process_name);

    std::stack<tchecker::syncprod::state_sptr_t> waiting;
    tchecker::syncprod::syncprod_t sp(_system, tchecker::ts::NO_SHARING, block_size, table_size);
    std::vector<tchecker::syncprod::syncprod_t::sst_t> v;

    sp.initial(v);
    for (auto && [status, state, transition] : v) {
      std::string state_name = namify(*state);
      if (!_product.is_location(pid, state_name)) {
        _product.add_location(pid, state_name, attributes(*state));
        waiting.push(state);
      }
    }
    v.clear();

    while (!waiting.empty()) {
      tchecker::syncprod::const_state_sptr_t src = static_cast<tchecker::syncprod::const_state_sptr_t>(waiting.top());
      waiting.pop();

      tchecker::loc_id_t src_id = _product.location(pid, namify(*src))->id();

      sp.next(src, v);
      for (auto && [status, tgt, transition] : v) {
        std::string tgt_name = namify(*tgt);
        if (!_product.is_location(pid, tgt_name)) {
          _product.add_location(pid, tgt_name, attributes(*tgt));
          waiting.push(tgt);
        }
        tchecker::loc_id_t tgt_id = _product.location(pid, tgt_name)->id();

        std::string event_name = namify(*transition);
        if (!_product.is_event(event_name))
          _product.add_event(event_name);
        tchecker::event_id_t event_id = _product.event_id(event_name);

        _product.add_edge(pid, src_id, tgt_id, event_id, attributes(*transition));
      }
      v.clear();
    }
  }